

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

stbi_uc * hdr_to_ldr(float *data,int x,int y,int comp)

{
  float fVar1;
  uint uVar2;
  stbi_uc *psVar3;
  long lVar4;
  uint uVar5;
  stbi_uc *psVar6;
  float *pfVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  double dVar12;
  
  uVar5 = x * y;
  psVar3 = (stbi_uc *)malloc((long)(int)(uVar5 * comp));
  if (psVar3 == (stbi_uc *)0x0) {
    free(data);
    failure_reason = "Out of memory";
    psVar3 = (stbi_uc *)0x0;
  }
  else {
    if (0 < (int)uVar5) {
      uVar2 = ((comp & 1U) + comp) - 1;
      lVar8 = (long)comp;
      uVar9 = 0;
      psVar6 = psVar3;
      pfVar7 = data;
      do {
        uVar10 = 0;
        if (0 < (int)uVar2) {
          uVar10 = 0;
          do {
            dVar12 = pow((double)(pfVar7[uVar10] * h2l_scale_i),(double)h2l_gamma_i);
            fVar11 = (float)dVar12 * 255.0 + 0.5;
            fVar1 = 0.0;
            if (0.0 <= fVar11) {
              fVar1 = fVar11;
            }
            fVar11 = 255.0;
            if (fVar1 <= 255.0) {
              fVar11 = fVar1;
            }
            psVar6[uVar10] = (stbi_uc)(int)fVar11;
            uVar10 = uVar10 + 1;
          } while (uVar2 != uVar10);
        }
        if ((int)uVar10 < comp) {
          lVar4 = (long)(int)uVar10 + uVar9 * lVar8;
          fVar11 = data[lVar4] * 255.0 + 0.5;
          fVar1 = 0.0;
          if (0.0 <= fVar11) {
            fVar1 = fVar11;
          }
          fVar11 = 255.0;
          if (fVar1 <= 255.0) {
            fVar11 = fVar1;
          }
          psVar3[lVar4] = (stbi_uc)(int)fVar11;
        }
        uVar9 = uVar9 + 1;
        pfVar7 = pfVar7 + lVar8;
        psVar6 = psVar6 + lVar8;
      } while (uVar9 != uVar5);
    }
    free(data);
  }
  return psVar3;
}

Assistant:

static stbi_uc *hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output = (stbi_uc *) malloc(x * y * comp);
   if (output == NULL) { free(data); return epuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*h2l_scale_i, h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
   }
   free(data);
   return output;
}